

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O3

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::DeleteElement(RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
                *this,RTPIPv6Destination *elem)

{
  undefined1 auVar1 [16];
  in_port_t iVar2;
  undefined8 uVar3;
  HashElement *pHVar4;
  HashElement *pHVar5;
  RTPMemoryManager *pRVar6;
  HashElement *pHVar7;
  undefined1 auVar8 [16];
  
  uVar3 = *(undefined8 *)((long)&(elem->rtpaddr).sin6_addr.__in6_u + 8);
  pHVar7 = this->table
           [((uint)(byte)((ulong)uVar3 >> 0x38) | (uint)((ulong)uVar3 >> 0x18) & 0xff0000 |
             (uint)((ulong)uVar3 >> 8) & 0xff000000 | (uint)((ulong)uVar3 >> 0x28) & 0xff00) %
            0x207d];
  this->curhashelem = pHVar7;
  if (pHVar7 != (HashElement *)0x0) {
    iVar2 = (elem->rtpaddr).sin6_port;
    do {
      if ((pHVar7->element).rtpaddr.sin6_port == iVar2) {
        auVar1 = *(undefined1 (*) [16])(elem->rtpaddr).sin6_addr.__in6_u.__u6_addr8;
        auVar8[0] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0] == auVar1[0]);
        auVar8[1] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[1] == auVar1[1]);
        auVar8[2] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[2] == auVar1[2]);
        auVar8[3] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[3] == auVar1[3]);
        auVar8[4] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[4] == auVar1[4]);
        auVar8[5] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[5] == auVar1[5]);
        auVar8[6] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[6] == auVar1[6]);
        auVar8[7] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[7] == auVar1[7]);
        auVar8[8] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[8] == auVar1[8]);
        auVar8[9] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[9] == auVar1[9]);
        auVar8[10] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[10] == auVar1[10]);
        auVar8[0xb] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xb] == auVar1[0xb]);
        auVar8[0xc] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xc] == auVar1[0xc]);
        auVar8[0xd] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xd] == auVar1[0xd]);
        auVar8[0xe] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xe] == auVar1[0xe]);
        auVar8[0xf] = -((pHVar7->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0xf] == auVar1[0xf]);
        if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
          pHVar4 = pHVar7->hashprev;
          pHVar5 = pHVar7->hashnext;
          if (pHVar4 == (HashElement *)0x0) {
            this->table[pHVar7->hashindex] = pHVar5;
          }
          else {
            pHVar4->hashnext = pHVar5;
          }
          if (pHVar5 != (HashElement *)0x0) {
            pHVar5->hashprev = pHVar4;
          }
          pHVar7 = this->curhashelem;
          pHVar4 = pHVar7->listprev;
          pHVar5 = pHVar7->listnext;
          if (pHVar4 == (HashElement *)0x0) {
            this->firsthashelem = pHVar5;
            if (pHVar5 == (HashElement *)0x0) {
              this->lasthashelem = (HashElement *)0x0;
            }
            else {
              pHVar5->listprev = (HashElement *)0x0;
            }
          }
          else {
            pHVar4->listnext = pHVar5;
            if (pHVar5 == (HashElement *)0x0) {
              this->lasthashelem = pHVar4;
            }
            else {
              pHVar5->listprev = pHVar4;
            }
          }
          pRVar6 = (this->super_RTPMemoryObject).mgr;
          if (pRVar6 == (RTPMemoryManager *)0x0) {
            operator_delete(pHVar7,0x60);
          }
          else {
            (**(code **)(*(long *)pRVar6 + 0x18))(pRVar6,pHVar7);
          }
          this->curhashelem = pHVar5;
          return 0;
        }
      }
      pHVar7 = pHVar7->hashnext;
      this->curhashelem = pHVar7;
    } while (pHVar7 != (HashElement *)0x0);
  }
  return -5;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteElement(const Element &elem)
{
	int status;

	status = GotoElement(elem);
	if (status < 0)
		return status;
	return DeleteCurrentElement();
}